

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onExitDeclareStatementAstNode
          (SemanticAnalyzerRun *this,DeclareStatementAstNode *node)

{
  element_type *this_00;
  element_type *variableName;
  shared_ptr<Token> local_28;
  DeclareStatementAstNode *local_18;
  DeclareStatementAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  local_18 = node;
  node_local = (DeclareStatementAstNode *)this;
  this_00 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->currentScope);
  variableName = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &local_18->identifier);
  std::shared_ptr<Token>::shared_ptr(&local_28,&local_18->identifier);
  Scope::define(this_00,&variableName->value,&local_28,true);
  std::shared_ptr<Token>::~shared_ptr(&local_28);
  return;
}

Assistant:

void onExitDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    this->currentScope->define(node->identifier->value, node->identifier, true);
  }